

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O3

int luaJIT_setmode(lua_State *L,int idx,int mode)

{
  byte *pbVar1;
  GCstr *pGVar2;
  uint uVar3;
  TValue *pTVar4;
  uint32_t uVar5;
  global_State *g;
  GCproto *pt;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  if ((g->jit_base).ptr32 != 0) {
    pTVar4 = L->top;
    L->top = pTVar4 + 1;
    pGVar2 = lj_err_str(L,LJ_ERR_JITMODE);
    (pTVar4->u32).lo = (uint32_t)pGVar2;
    (pTVar4->field_2).it = 0xfffffffb;
    if (g->panic != (lua_CFunction)0x0) {
      (*g->panic)(L);
    }
    exit(1);
  }
  pbVar1 = (byte *)((long)&g[1].gc.tabnum + 4);
  *pbVar1 = *pbVar1 & 0xef;
  if ((g->hookmask & 0x40) != 0) {
    lj_err_caller(L,LJ_ERR_NOGCMM);
  }
  uVar3 = mode & 0xff;
  if (4 < uVar3) {
    if (uVar3 == 5) {
      if (((uint)mode >> 9 & 1) != 0) {
        lj_trace_flush((jit_State *)(g + 1),idx);
        return 1;
      }
      return 0;
    }
    if (uVar3 != 0x10) {
      return 0;
    }
    if (((uint)mode >> 8 & 1) == 0) {
      g->bc_cfunc_ext = 0x5f;
      return 1;
    }
    if (idx != 0) {
      if (idx < 1) {
        pTVar4 = L->top + idx;
      }
      else {
        pTVar4 = L->base + ((ulong)(uint)idx - 1);
      }
      if (((pTVar4->field_2).it & 0xffff8000) == 0xffff0000) {
        g->wrapf = (lua_CFunction)
                   (pTVar4->u64 & 0x7fffffffff |
                   (ulong)*(uint *)((ulong)(g->gc).lightudseg.ptr32 +
                                   (pTVar4->u64 >> 0x27 & 0xff) * 4) << 0x20);
        g->bc_cfunc_ext = 0x60;
        return 1;
      }
      return 0;
    }
    return 0;
  }
  if (2 < uVar3 - 2) {
    if (uVar3 != 0) {
      return 0;
    }
    if (((uint)mode >> 9 & 1) == 0) {
      *(uint *)&g[1].gc.freed = (uint)mode >> 8 & 1 | (uint)g[1].gc.freed & 0xfffffffe;
      lj_dispatch_update(g);
      return 1;
    }
    lj_trace_flushall(L);
    return 1;
  }
  if (idx == 0) {
    pTVar4 = L->base;
    uVar3 = *(uint *)((long)pTVar4 + -4);
    if (((long)(int)uVar3 & 3U) == 0) {
      pTVar4 = pTVar4 + (-2 - (ulong)*(byte *)((ulong)uVar3 - 3));
    }
    else {
      pTVar4 = (TValue *)((long)pTVar4 + (-8 - ((long)(int)uVar3 & 0xfffffffffffffff8U)));
    }
LAB_00113206:
    if (*(char *)((ulong)(pTVar4->u32).lo + 6) == '\0') {
      pt = (GCproto *)((ulong)*(uint *)((ulong)(pTVar4->u32).lo + 0x10) - 0x40);
      goto LAB_00113223;
    }
    uVar5 = (pTVar4->field_2).it;
  }
  else {
    if (idx < 1) {
      pTVar4 = L->top + idx;
    }
    else {
      pTVar4 = L->base + ((ulong)(uint)idx - 1);
    }
    uVar5 = (pTVar4->field_2).it;
    if (uVar5 == 0xfffffff7) goto LAB_00113206;
  }
  if (uVar5 != 0xfffffff8) {
    return 0;
  }
  pt = (GCproto *)(ulong)(pTVar4->u32).lo;
LAB_00113223:
  if (((mode & 0xffU) != 4) && (setptmode(g,pt,mode), (mode & 0xffU) == 2)) {
    return 1;
  }
  setptmode_all(g,pt,mode);
  return 1;
}

Assistant:

int luaJIT_setmode(lua_State *L, int idx, int mode)
{
  global_State *g = G(L);
  int mm = mode & LUAJIT_MODE_MASK;
  /* Forbid JIT state change while running the trace */
  if (tvref(g->jit_base)) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITMODE));
    if (g->panic) g->panic(L);
    exit(EXIT_FAILURE);
  }
  lj_trace_abort(g);  /* Abort recording on any state change. */
  /* Avoid pulling the rug from under our own feet. */
  if ((g->hookmask & HOOK_GC))
    lj_err_caller(L, LJ_ERR_NOGCMM);
  switch (mm) {
#if LJ_HASJIT
  case LUAJIT_MODE_ENGINE:
    if ((mode & LUAJIT_MODE_FLUSH)) {
      lj_trace_flushall(L);
    } else {
      if (!(mode & LUAJIT_MODE_ON))
	G2J(g)->flags &= ~(uint32_t)JIT_F_ON;
      else
	G2J(g)->flags |= (uint32_t)JIT_F_ON;
      lj_dispatch_update(g);
    }
    break;
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC: {
    cTValue *tv = idx == 0 ? frame_prev(L->base-1)-LJ_FR2 :
		  idx > 0 ? L->base + (idx-1) : L->top + idx;
    GCproto *pt;
    if ((idx == 0 || tvisfunc(tv)) && isluafunc(&gcval(tv)->fn))
      pt = funcproto(&gcval(tv)->fn);  /* Cannot use funcV() for frame slot. */
    else if (tvisproto(tv))
      pt = protoV(tv);
    else
      return 0;  /* Failed. */
    if (mm != LUAJIT_MODE_ALLSUBFUNC)
      setptmode(g, pt, mode);
    if (mm != LUAJIT_MODE_FUNC)
      setptmode_all(g, pt, mode);
    break;
    }
  case LUAJIT_MODE_TRACE:
    if (!(mode & LUAJIT_MODE_FLUSH))
      return 0;  /* Failed. */
    lj_trace_flush(G2J(g), idx);
    break;
#else
  case LUAJIT_MODE_ENGINE:
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC:
    UNUSED(idx);
    if ((mode & LUAJIT_MODE_ON))
      return 0;  /* Failed. */
    break;
#endif
  case LUAJIT_MODE_WRAPCFUNC:
    if ((mode & LUAJIT_MODE_ON)) {
      if (idx != 0) {
	cTValue *tv = idx > 0 ? L->base + (idx-1) : L->top + idx;
	if (tvislightud(tv))
	  g->wrapf = (lua_CFunction)lightudV(g, tv);
	else
	  return 0;  /* Failed. */
      } else {
	return 0;  /* Failed. */
      }
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCCW, 0, 0);
    } else {
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCC, 0, 0);
    }
    break;
  default:
    return 0;  /* Failed. */
  }
  return 1;  /* OK. */
}